

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraph.cpp
# Opt level: O3

void __thiscall ControlFlowGraph::buildFunction(ControlFlowGraph *this,Function *function)

{
  _Head_base<0UL,_GraphBuilder_*,_false> _Var1;
  NodeSequence NVar2;
  set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> locks;
  _Rb_tree<LockNode_*,_LockNode_*,_std::_Identity<LockNode_*>,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>
  local_50;
  
  NVar2 = GraphBuilder::buildFunction
                    ((this->graphBuilder)._M_t.
                     super___uniq_ptr_impl<GraphBuilder,_std::default_delete<GraphBuilder>_>._M_t.
                     super__Tuple_impl<0UL,_GraphBuilder_*,_std::default_delete<GraphBuilder>_>.
                     super__Head_base<0UL,_GraphBuilder_*,_false>._M_head_impl,function);
  GraphBuilder::matchForksAndJoins
            ((this->graphBuilder)._M_t.
             super___uniq_ptr_impl<GraphBuilder,_std::default_delete<GraphBuilder>_>._M_t.
             super__Tuple_impl<0UL,_GraphBuilder_*,_std::default_delete<GraphBuilder>_>.
             super__Head_base<0UL,_GraphBuilder_*,_false>._M_head_impl);
  GraphBuilder::matchLocksAndUnlocks
            ((this->graphBuilder)._M_t.
             super___uniq_ptr_impl<GraphBuilder,_std::default_delete<GraphBuilder>_>._M_t.
             super__Tuple_impl<0UL,_GraphBuilder_*,_std::default_delete<GraphBuilder>_>.
             super__Head_base<0UL,_GraphBuilder_*,_false>._M_head_impl);
  GraphBuilder::getLocks
            ((set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> *)&local_50,
             (this->graphBuilder)._M_t.
             super___uniq_ptr_impl<GraphBuilder,_std::default_delete<GraphBuilder>_>._M_t.
             super__Tuple_impl<0UL,_GraphBuilder_*,_std::default_delete<GraphBuilder>_>.
             super__Head_base<0UL,_GraphBuilder_*,_false>._M_head_impl);
  for (; (_Rb_tree_header *)local_50._M_impl.super__Rb_tree_header._M_header._M_left !=
         &local_50._M_impl.super__Rb_tree_header;
      local_50._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_50._M_impl.super__Rb_tree_header._M_header._M_left)) {
    CriticalSectionsBuilder::buildCriticalSection
              ((this->criticalSectionsBuilder)._M_t.
               super___uniq_ptr_impl<CriticalSectionsBuilder,_std::default_delete<CriticalSectionsBuilder>_>
               ._M_t.
               super__Tuple_impl<0UL,_CriticalSectionsBuilder_*,_std::default_delete<CriticalSectionsBuilder>_>
               .super__Head_base<0UL,_CriticalSectionsBuilder_*,_false>._M_head_impl,
               *(LockNode **)(local_50._M_impl.super__Rb_tree_header._M_header._M_left + 1));
  }
  _Var1._M_head_impl =
       (this->graphBuilder)._M_t.
       super___uniq_ptr_impl<GraphBuilder,_std::default_delete<GraphBuilder>_>._M_t.
       super__Tuple_impl<0UL,_GraphBuilder_*,_std::default_delete<GraphBuilder>_>.
       super__Head_base<0UL,_GraphBuilder_*,_false>._M_head_impl;
  ThreadRegionsBuilder::reserve
            ((this->threadRegionsBuilder)._M_t.
             super___uniq_ptr_impl<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_ThreadRegionsBuilder_*,_std::default_delete<ThreadRegionsBuilder>_>
             .super__Head_base<0UL,_ThreadRegionsBuilder_*,_false>._M_head_impl,
             *(size_type *)((long)&(_Var1._M_head_impl)->artificialNodes_ + 0x18) +
             *(size_type *)((long)&(_Var1._M_head_impl)->llvmToNodeMap_ + 0x18));
  ThreadRegionsBuilder::build
            ((this->threadRegionsBuilder)._M_t.
             super___uniq_ptr_impl<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_ThreadRegionsBuilder_*,_std::default_delete<ThreadRegionsBuilder>_>
             .super__Head_base<0UL,_ThreadRegionsBuilder_*,_false>._M_head_impl,NVar2.first);
  std::
  _Rb_tree<LockNode_*,_LockNode_*,_std::_Identity<LockNode_*>,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>
  ::_M_erase(&local_50,(_Link_type)local_50._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void ControlFlowGraph::buildFunction(const llvm::Function *function) {
    auto nodeSeq = graphBuilder->buildFunction(function);
    graphBuilder->matchForksAndJoins();
    graphBuilder->matchLocksAndUnlocks();

    auto locks = graphBuilder->getLocks();

    for (auto *lock : locks) {
        criticalSectionsBuilder->buildCriticalSection(lock);
    }

    threadRegionsBuilder->reserve(graphBuilder->size());
    threadRegionsBuilder->build(nodeSeq.first);
}